

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O0

void __thiscall crnlib::semaphore::release(semaphore *this,long releaseCount)

{
  long in_RSI;
  undefined8 *in_RDI;
  int status;
  uint in_stack_000001d4;
  char *in_stack_000001d8;
  char *in_stack_000001e0;
  int local_14;
  long local_10;
  
  local_14 = 0;
  local_10 = in_RSI;
  while ((0 < local_10 && (local_14 = sem_post((sem_t *)*in_RDI), local_14 == 0))) {
    local_10 = local_10 + -1;
  }
  if (local_14 != 0) {
    crnlib_fail(in_stack_000001e0,in_stack_000001d8,in_stack_000001d4);
  }
  return;
}

Assistant:

void semaphore::release(long releaseCount) {
  CRNLIB_ASSERT(releaseCount >= 1);

  int status = 0;
#ifdef WIN32
  if (1 == releaseCount)
    status = sem_post(m_sem);
  else
    status = sem_post_multiple(m_sem, releaseCount);
#else
  while (releaseCount > 0) {
    status = sem_post(m_sem);
    if (status)
      break;
    releaseCount--;
  }
#endif

  if (status) {
    CRNLIB_FAIL("semaphore: sem_post() or sem_post_multiple() failed");
  }
}